

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FLog.h
# Opt level: O2

void __thiscall
FONQRI::UserLog::UserLog
          (UserLog *this,string *dateTime,string *line,string *file,string *text,string *type,
          string *user)

{
  std::__cxx11::string::string((string *)this,(string *)dateTime);
  std::__cxx11::string::string((string *)&this->line,(string *)line);
  std::__cxx11::string::string((string *)&this->file,(string *)file);
  std::__cxx11::string::string((string *)&this->text,(string *)text);
  std::__cxx11::string::string((string *)&this->type,(string *)type);
  std::__cxx11::string::string((string *)&this->user,(string *)user);
  return;
}

Assistant:

UserLog(std::string dateTime, std::string line, std::string file,
		std::string text, std::string type, std::string user)
	: dateTime(dateTime), line(line), file(file), text(text), type(type),
	  user(user)
	{
	}